

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O2

void __thiscall
SuiteTimeRangeTests::TestisInRangeWithDay_SameDay::RunImpl(TestisInRangeWithDay_SameDay *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_c8;
  UtcTimeStamp now;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  TimeRange timeRange;
  
  FIX::UtcTimeOnly::UtcTimeOnly(&startTime,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly(&endTime,0x12,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&now.super_DateTime,2,0,0,0x1c,7,0x7d4);
  FIX::TimeRange::TimeRange(&timeRange,&startTime,&endTime,2,2);
  bVar1 = FIX::TimeRange::isInRange(&startTime,&endTime,2,2,&now.super_DateTime);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_c8,*ppTVar3,0x95);
    UnitTest::TestResults::OnTestFailure
              (this_00,&local_c8,"TimeRange::isInRange(startTime, endTime, startDay, endDay, now)");
  }
  return;
}

Assistant:

TEST(isInRangeWithDay_SameDay)
{
  UtcTimeOnly startTime( 3, 0, 0 );
  UtcTimeOnly endTime( 18, 0, 0 );
  int startDay = 2;
  int endDay = 2;

  UtcTimeStamp now( 2, 0, 0, 28, 7, 2004 );
  TimeRange timeRange(startTime, endTime, startDay, endDay);
  CHECK(TimeRange::isInRange(startTime, endTime, startDay, endDay, now));
}